

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O0

void __thiscall OpenMD::MoleculeStamp::checkCutoffGroups(MoleculeStamp *this)

{
  ulong uVar1;
  bool bVar2;
  reference ppAVar3;
  size_t sVar4;
  ostream *poVar5;
  OpenMDException *this_00;
  long in_RDI;
  ostringstream oss;
  iterator j;
  vector<int,_std::allocator<int>_> cutoffGroupAtoms;
  CutoffGroupStamp *cutoffGroupStamp;
  size_t i;
  iterator fai;
  iterator ai;
  iterator in_stack_fffffffffffffce8;
  MoleculeStamp *in_stack_fffffffffffffcf0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffcf8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd08;
  const_iterator in_stack_fffffffffffffd10;
  const_iterator in_stack_fffffffffffffd18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_fffffffffffffd20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  string local_240 [32];
  ostringstream local_220 [376];
  int *local_a8;
  long local_90;
  int *local_70;
  int *local_68;
  int *local_60;
  int local_58 [6];
  CutoffGroupStamp *local_40;
  ulong local_38;
  int local_2c;
  AtomStamp **local_28;
  AtomStamp **local_20;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_18;
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  local_10 [2];
  
  __gnu_cxx::
  __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
  ::__normal_iterator(local_10);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_18);
  local_20 = (AtomStamp **)
             std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::begin
                       ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)
                        in_stack_fffffffffffffce8._M_current);
  local_10[0]._M_current = local_20;
  while( true ) {
    local_28 = (AtomStamp **)
               std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>::end
                         ((vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_> *)
                          in_stack_fffffffffffffce8._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
                        *)in_stack_fffffffffffffcf0,
                       (__normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
                        *)in_stack_fffffffffffffce8._M_current);
    if (!bVar2) break;
    ppAVar3 = __gnu_cxx::
              __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
              ::operator*(local_10);
    local_2c = AtomStamp::getIndex(*ppAVar3);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcf0,
               in_stack_fffffffffffffce8._M_current);
    __gnu_cxx::
    __normal_iterator<OpenMD::AtomStamp_**,_std::vector<OpenMD::AtomStamp_*,_std::allocator<OpenMD::AtomStamp_*>_>_>
    ::operator++(local_10);
  }
  local_38 = 0;
  while( true ) {
    uVar1 = local_38;
    sVar4 = getNCutoffGroups((MoleculeStamp *)0x36a8b6);
    if (sVar4 <= uVar1) {
      return;
    }
    local_40 = getCutoffGroupStamp(in_stack_fffffffffffffcf0,
                                   (int)((ulong)in_stack_fffffffffffffce8._M_current >> 0x20));
    __first._M_current = local_58;
    CutoffGroupStamp::getMembers((CutoffGroupStamp *)in_stack_fffffffffffffce8._M_current);
    local_68 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                (in_stack_fffffffffffffce8._M_current);
    local_70 = (int *)std::vector<int,_std::allocator<int>_>::end
                                (in_stack_fffffffffffffce8._M_current);
    sVar4 = getNAtoms((MoleculeStamp *)0x36a928);
    local_90 = sVar4 - 1;
    std::bind<std::greater<int>,std::_Placeholder<1>const&,unsigned_long>
              ((greater<int> *)in_stack_fffffffffffffcf8._M_current,
               (_Placeholder<1> *)in_stack_fffffffffffffcf0,
               (unsigned_long *)in_stack_fffffffffffffce8._M_current);
    in_stack_fffffffffffffd20 =
         std::
         find_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::_Bind<std::greater<int>(std::_Placeholder<1>,unsigned_long)>>
                   (__first,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18._M_current);
    local_60 = in_stack_fffffffffffffd20._M_current;
    local_a8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                (in_stack_fffffffffffffce8._M_current);
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffcf0,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffffce8._M_current);
    if (bVar2) break;
    local_18._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffce8._M_current);
    while( true ) {
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8._M_current);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffcf0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffce8._M_current);
      if (!bVar2) break;
      in_stack_fffffffffffffcf0 = (MoleculeStamp *)(in_RDI + 0x100);
      std::vector<int,_std::allocator<int>_>::begin
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8._M_current);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8._M_current);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_18);
      in_stack_fffffffffffffcf8 =
           std::remove<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int>
                     (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                      in_stack_fffffffffffffcf8._M_current);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffcf0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffce8._M_current);
      std::vector<int,_std::allocator<int>_>::end
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffce8._M_current);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffcf0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 in_stack_fffffffffffffce8._M_current);
      in_stack_fffffffffffffce8 =
           std::vector<int,_std::allocator<int>_>::erase
                     (in_stack_fffffffffffffd08._M_current,in_stack_fffffffffffffd18,
                      in_stack_fffffffffffffd10);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_18);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd00._M_current);
    local_38 = local_38 + 1;
  }
  std::__cxx11::ostringstream::ostringstream(local_220);
  poVar5 = std::operator<<((ostream *)local_220,"Error in Molecule ");
  getName_abi_cxx11_((MoleculeStamp *)in_stack_fffffffffffffce8._M_current);
  poVar5 = std::operator<<(poVar5,local_240);
  poVar5 = std::operator<<(poVar5,": cutoffGroup");
  std::operator<<(poVar5," is out of range\n");
  std::__cxx11::string::~string(local_240);
  this_00 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::ostringstream::str();
  OpenMDException::OpenMDException(this_00,(string *)in_stack_fffffffffffffcf8._M_current);
  __cxa_throw(this_00,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void MoleculeStamp::checkCutoffGroups() {
    std::vector<AtomStamp*>::iterator ai;
    std::vector<int>::iterator fai;

    // add all atoms into freeAtoms_ set
    for (ai = atomStamps_.begin(); ai != atomStamps_.end(); ++ai) {
      freeAtoms_.push_back((*ai)->getIndex());
    }

    for (std::size_t i = 0; i < getNCutoffGroups(); ++i) {
      CutoffGroupStamp* cutoffGroupStamp = getCutoffGroupStamp(i);
      std::vector<int> cutoffGroupAtoms  = cutoffGroupStamp->getMembers();
      std::vector<int>::iterator j =
          std::find_if(cutoffGroupAtoms.begin(), cutoffGroupAtoms.end(),
                       std::bind(std::greater<int>(), std::placeholders::_1,
                                 getNAtoms() - 1));
      if (j != cutoffGroupAtoms.end()) {
        std::ostringstream oss;
        oss << "Error in Molecule " << getName() << ": cutoffGroup"
            << " is out of range\n";
        throw OpenMDException(oss.str());
      }

      for (fai = cutoffGroupAtoms.begin(); fai != cutoffGroupAtoms.end();
           ++fai) {
        // erase the atoms belonging to cutoff groups from freeAtoms_ vector
        freeAtoms_.erase(
            std::remove(freeAtoms_.begin(), freeAtoms_.end(), (*fai)),
            freeAtoms_.end());
      }
    }
  }